

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_synaptic_enhancement(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  int in_EDI;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  CHAR_DATA *in_stack_ffffffffffffff80;
  
  bVar1 = is_affected(in_RCX,in_EDI);
  if (bVar1) {
    send_to_char((char *)in_stack_ffffffffffffff80,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  else {
    bVar1 = is_affected(in_RCX,(int)gsn_synaptic_impairment);
    if (bVar1) {
      send_to_char((char *)in_stack_ffffffffffffff80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      act((char *)in_stack_ffffffffffffff80,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
          in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
      affect_strip(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
    else {
      init_affect((AFFECT_DATA *)0x6d8fc0);
      get_spell_aftype(in_stack_ffffffffffffff68);
      affect_to_char(in_stack_ffffffffffffff70,(AFFECT_DATA *)in_stack_ffffffffffffff68);
      act((char *)in_stack_ffffffffffffff80,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
          in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
      act((char *)in_stack_ffffffffffffff80,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
          in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
    }
  }
  return;
}

Assistant:

void spell_synaptic_enhancement(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn))
	{
		send_to_char("They are already affected by synaptic enhancement.\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_synaptic_impairment))
	{
		send_to_char("The haze lifts from your mind, and you can think clearly once again.\n\r", victim);
		act("$n appears to be thinking normally again.", victim, nullptr, nullptr, TO_ROOM);
		affect_strip(victim, gsn_synaptic_impairment);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.location = 0;
	af.modifier = 0;
	af.duration = level / 4;
	af.mod_name = MOD_CONC;
	affect_to_char(victim, &af);

	act("$n twitches as $e suddenly looks more aware.", victim, 0, 0, TO_ROOM);
	act("Your mind suddenly feels much clearer and your reflexes sharpen.", victim, 0, 0, TO_CHAR);
}